

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::PlainGatherInt2DArray::VerifyCompute(PlainGatherInt2DArray *this)

{
  ulong uVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  float local_58;
  uint auStack_54 [3];
  undefined1 local_48 [12];
  float local_3c;
  undefined1 local_38 [8];
  float local_30;
  undefined1 local_28 [4];
  float local_24;
  
  puVar5 = (uint *)glu::CallLogWrapper::glMapBufferRange
                             (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.
                               super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x10,1);
  local_58 = 4.2039e-45;
  auStack_54[0] = 7;
  auStack_54[1] = 0xb;
  auStack_54[2] = 0xf;
  if (*puVar5 == 3) {
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 == 2) {
        return 0;
      }
      lVar3 = uVar6 + 2;
      uVar1 = uVar6 + 1;
      lVar4 = uVar6 + 1;
      uVar6 = uVar1;
    } while (puVar5[lVar3] == auStack_54[lVar4]);
    if (2 < uVar1) {
      return 0;
    }
  }
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
            (&local_58,this);
  dVar2 = (double)local_58;
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
            (local_28,this);
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
            (local_38,this);
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
            (local_48,this);
  anon_unknown_0::Output
            ("Expected %d, %d, %d, %d, got: %d, %d, %d, %d",SUB84(dVar2,0),(double)local_24,
             (double)local_30,(double)local_3c,(ulong)*puVar5,(ulong)puVar5[1],(ulong)puVar5[2],
             (ulong)puVar5[3]);
  return -1;
}

Assistant:

virtual long VerifyCompute()
	{
		IVec4* data;
		data = static_cast<IVec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
		if (data[0] != IVec4(3, 7, 11, 15))
		{
			Output("Expected %d, %d, %d, %d, got: %d, %d, %d, %d", Expected().x(), Expected().y(), Expected().z(),
				   Expected().w(), data[0].x(), data[0].y(), data[0].z(), data[0].w());
			return ERROR;
		}
		return NO_ERROR;
	}